

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

Stmt * __thiscall kratos::ActiveVisitor::get_reset_stmt(ActiveVisitor *this,Port *port)

{
  bool bVar1;
  mapped_type *ppSVar2;
  _Node_iterator_base<std::pair<kratos::Port_*const,_kratos::Stmt_*>,_false> local_30;
  _Node_iterator_base<std::pair<kratos::Port_*const,_kratos::Stmt_*>,_false> local_28;
  Port *local_20;
  Port *port_local;
  ActiveVisitor *this_local;
  
  local_20 = port;
  port_local = (Port *)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<kratos::Port_*,_kratos::Stmt_*,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>_>
       ::find(&this->reset_stmt_,&local_20);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<kratos::Port_*,_kratos::Stmt_*,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>_>
       ::end(&this->reset_stmt_);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppSVar2 = std::
              unordered_map<kratos::Port_*,_kratos::Stmt_*,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>_>
              ::at(&this->reset_stmt_,&local_20);
    this_local = (ActiveVisitor *)*ppSVar2;
  }
  else {
    this_local = (ActiveVisitor *)0x0;
  }
  return (Stmt *)this_local;
}

Assistant:

Stmt* get_reset_stmt(Port* port) const {
        if (reset_stmt_.find(port) != reset_stmt_.end()) return reset_stmt_.at(port);
        return nullptr;
    }